

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

TransactionController * __thiscall
cfd::api::TransactionApi::AddMultisigSign
          (TransactionApi *this,string *tx_hex,TxInReference *txin,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          AddressType address_type,Script *witness_script,Script *redeem_script,bool clear_stack)

{
  AbstractTxInReference *in_RCX;
  TransactionController *in_RDI;
  Script *in_R8;
  Script *in_stack_00000008;
  Script *in_stack_00000010;
  undefined1 in_stack_00000018;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined1 in_stack_ffffffffffffff8f;
  pointer in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff9c;
  Txid *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  TransactionApi *in_stack_ffffffffffffffb0;
  undefined3 in_stack_ffffffffffffffd0;
  AddressType address_type_00;
  
  address_type_00 = CONCAT13(in_stack_00000018,in_stack_ffffffffffffffd0) & 0x1ffffff;
  core::AbstractTxInReference::GetTxid
            ((AbstractTxInReference *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  core::AbstractTxInReference::GetVout(in_RCX);
  cfd::core::Script::Script((Script *)&stack0xffffffffffffff68,in_stack_00000010);
  AddMultisigSign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff9c,
                  (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                  in_stack_ffffffffffffff90,address_type_00,in_R8,(Script *)in_RCX,
                  (bool)in_stack_ffffffffffffff8f);
  core::Script::~Script(in_stack_00000008);
  core::Txid::~Txid((Txid *)0x3efdfc);
  return in_RDI;
}

Assistant:

TransactionController TransactionApi::AddMultisigSign(
    const std::string& tx_hex, const TxInReference& txin,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script redeem_script,
    bool clear_stack) {
  return AddMultisigSign(
      tx_hex, txin.GetTxid(), txin.GetVout(), sign_list, address_type,
      witness_script, redeem_script, clear_stack);
}